

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

float __thiscall nv::Filter::sampleTriangle(Filter *this,float x,float scale,int samples)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float extraout_XMM0_Da;
  
  if (samples < 1) {
    fVar2 = 0.0;
  }
  else {
    iVar1 = 0;
    fVar2 = 0.0;
    do {
      fVar3 = ((float)iVar1 + (float)iVar1 + 1.0) * (1.0 / (float)samples);
      (*this->_vptr_Filter[2])((fVar3 + x + -0.5) * scale,this);
      fVar2 = fVar2 + (float)(~-(uint)(1.0 < fVar3) & (uint)fVar3 |
                             (uint)(2.0 - fVar3) & -(uint)(1.0 < fVar3)) * extraout_XMM0_Da;
      iVar1 = iVar1 + 1;
    } while (samples != iVar1);
    fVar2 = fVar2 + fVar2;
  }
  return (1.0 / (float)samples) * fVar2;
}

Assistant:

float Filter::sampleTriangle(float x, float scale, int samples) const
{
	float sum = 0;
	float isamples = 1.0f / float(samples);

	for(int s = 0; s < samples; s++)
	{
		float offset = (2 * float(s) + 1.0f) * isamples;		
		float p = (x + offset - 0.5f) * scale;
		float value = evaluate(p);
		
		float weight = offset;
		if (weight > 1.0f) weight = 2.0f - weight;
		
		sum += value * weight;
	}
	
	return 2 * sum * isamples;
}